

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_FixedPoint(N_Vector y,int m,SUNContext sunctx)

{
  N_Vector y_00;
  undefined8 *__s;
  SUNNonlinearSolver in_RDX;
  undefined4 in_ESI;
  SUNNonlinearSolverContent_FixedPoint content;
  SUNNonlinearSolver NLS;
  SUNContext sunctx_local_scope_;
  
  y_00 = (N_Vector)SUNNonlinSolNewEmpty(in_RDX);
  y_00->ops->nvgetvectorid = SUNNonlinSolGetType_FixedPoint;
  y_00->ops->nvclone = SUNNonlinSolInitialize_FixedPoint;
  y_00->ops->nvdestroy = SUNNonlinSolSolve_FixedPoint;
  y_00->ops->nvspace = SUNNonlinSolFree_FixedPoint;
  y_00->ops->nvgetarraypointer = SUNNonlinSolSetSysFn_FixedPoint;
  y_00->ops->nvgetcommunicator = SUNNonlinSolSetConvTestFn_FixedPoint;
  y_00->ops->nvgetlength = SUNNonlinSolSetMaxIters_FixedPoint;
  y_00->ops->nvgetlocallength = SUNNonlinSolGetNumIters_FixedPoint;
  y_00->ops->nvlinearsum = SUNNonlinSolGetCurIter_FixedPoint;
  y_00->ops->nvconst = SUNNonlinSolGetNumConvFails_FixedPoint;
  __s = (undefined8 *)malloc(0xb0);
  memset(__s,0,0xb0);
  y_00->content = __s;
  *__s = 0;
  __s[1] = 0;
  *(undefined4 *)(__s + 2) = in_ESI;
  *(undefined4 *)(__s + 4) = 0;
  __s[5] = 0x3ff0000000000000;
  *(undefined4 *)(__s + 0x12) = 0;
  *(undefined4 *)((long)__s + 0x94) = 3;
  __s[0x13] = 0;
  __s[0x14] = 0;
  __s[0x15] = 0;
  AllocateContent(in_RDX,y_00);
  return (SUNNonlinearSolver)y_00;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_FixedPoint(N_Vector y, int m, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNNonlinearSolver NLS                       = NULL;
  SUNNonlinearSolverContent_FixedPoint content = NULL;

  /* Check that the supplied N_Vector supports all required operations */
  SUNAssertNull(y->ops->nvclone && y->ops->nvdestroy && y->ops->nvscale &&
                  y->ops->nvlinearsum && y->ops->nvdotprod,
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create nonlinear linear solver */
  NLS = SUNNonlinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  NLS->ops->gettype         = SUNNonlinSolGetType_FixedPoint;
  NLS->ops->initialize      = SUNNonlinSolInitialize_FixedPoint;
  NLS->ops->solve           = SUNNonlinSolSolve_FixedPoint;
  NLS->ops->free            = SUNNonlinSolFree_FixedPoint;
  NLS->ops->setsysfn        = SUNNonlinSolSetSysFn_FixedPoint;
  NLS->ops->setctestfn      = SUNNonlinSolSetConvTestFn_FixedPoint;
  NLS->ops->setmaxiters     = SUNNonlinSolSetMaxIters_FixedPoint;
  NLS->ops->getnumiters     = SUNNonlinSolGetNumIters_FixedPoint;
  NLS->ops->getcuriter      = SUNNonlinSolGetCurIter_FixedPoint;
  NLS->ops->getnumconvfails = SUNNonlinSolGetNumConvFails_FixedPoint;

  /* Create nonlinear solver content structure */
  content = NULL;
  content = (SUNNonlinearSolverContent_FixedPoint)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Initialize all components of content to 0/NULL */
  memset(content, 0, sizeof(struct _SUNNonlinearSolverContent_FixedPoint));

  /* Attach content */
  NLS->content = content;

  /* Fill general content */
  content->Sys        = NULL;
  content->CTest      = NULL;
  content->m          = m;
  content->damping    = SUNFALSE;
  content->beta       = ONE;
  content->curiter    = 0;
  content->maxiters   = 3;
  content->niters     = 0;
  content->nconvfails = 0;
  content->ctest_data = NULL;

  /* Fill allocatable content */
  SUNCheckCallNull(AllocateContent(NLS, y));

  return (NLS);
}